

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRegExecCtxtPtr xmlRelaxNGElemPop(xmlRelaxNGValidCtxtPtr ctxt)

{
  xmlRegExecCtxtPtr ret;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (ctxt->elemNr < 1) {
    ctxt_local = (xmlRelaxNGValidCtxtPtr)0x0;
  }
  else {
    ctxt->elemNr = ctxt->elemNr + -1;
    ctxt_local = (xmlRelaxNGValidCtxtPtr)ctxt->elemTab[ctxt->elemNr];
    ctxt->elemTab[ctxt->elemNr] = (xmlRegExecCtxtPtr)0x0;
    if (ctxt->elemNr < 1) {
      ctxt->elem = (xmlRegExecCtxtPtr)0x0;
    }
    else {
      ctxt->elem = ctxt->elemTab[ctxt->elemNr + -1];
    }
  }
  return (xmlRegExecCtxtPtr)ctxt_local;
}

Assistant:

static xmlRegExecCtxtPtr
xmlRelaxNGElemPop(xmlRelaxNGValidCtxtPtr ctxt)
{
    xmlRegExecCtxtPtr ret;

    if (ctxt->elemNr <= 0)
        return (NULL);
    ctxt->elemNr--;
    ret = ctxt->elemTab[ctxt->elemNr];
    ctxt->elemTab[ctxt->elemNr] = NULL;
    if (ctxt->elemNr > 0)
        ctxt->elem = ctxt->elemTab[ctxt->elemNr - 1];
    else
        ctxt->elem = NULL;
    return (ret);
}